

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::dxt_hc::selector_indices_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  selector_indices_details *pDst;
  selector_indices_details *pSrc_end;
  selector_indices_details *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  pDst = (selector_indices_details *)pDst_void;
  for (pSrc = (selector_indices_details *)pSrc_void;
      pSrc != (selector_indices_details *)((long)pSrc_void + (ulong)num * 6); pSrc = pSrc + 1) {
    *(undefined4 *)&pDst->field_0 = *(undefined4 *)&pSrc->field_0;
    (pDst->field_0).field_0.alpha1 = (pSrc->field_0).field_0.alpha1;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }